

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# excl.c
# Opt level: O3

int nn_excl_recv(nn_excl *self,nn_msg *msg)

{
  uint uVar1;
  ulong uVar2;
  
  if (self->inpipe == (nn_pipe *)0x0) {
    uVar1 = 0xfffffff5;
  }
  else {
    uVar1 = nn_pipe_recv(self->inpipe,msg);
    if ((int)uVar1 < 0) {
      uVar2 = (ulong)uVar1;
      nn_excl_recv_cold_1();
      return (int)(*(long *)(uVar2 + 0x10) != 0);
    }
    if ((uVar1 & 1) != 0) {
      self->inpipe = (nn_pipe *)0x0;
    }
    uVar1 = uVar1 & 0x7ffffffe;
  }
  return uVar1;
}

Assistant:

int nn_excl_recv (struct nn_excl *self, struct nn_msg *msg)
{
    int rc;

    if (nn_slow (!self->inpipe))
        return -EAGAIN;

    rc = nn_pipe_recv (self->inpipe, msg);
    errnum_assert (rc >= 0, -rc);

    if (rc & NN_PIPE_RELEASE)
        self->inpipe = NULL;

    return rc & ~NN_PIPE_RELEASE;
}